

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::Diagnostic>::
emplace_back<slang::ast::Symbol_const&,slang::DiagCode&,slang::SourceLocation&>
          (SmallVectorBase<slang::Diagnostic> *this,Symbol *args,DiagCode *args_1,
          SourceLocation *args_2)

{
  SourceLocation *in_RCX;
  DiagCode *in_RDX;
  SmallVectorBase<slang::Diagnostic> *in_RDI;
  SourceLocation *in_stack_00000010;
  DiagCode *in_stack_00000018;
  Symbol *in_stack_ffffffffffffffb8;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::Symbol_const&,slang::DiagCode&,slang::SourceLocation&>
                        ((SmallVectorBase<slang::Diagnostic> *)args,(pointer)args_1,(Symbol *)args_2
                         ,in_stack_00000018,in_stack_00000010);
  }
  else {
    end(in_RDI);
    Diagnostic::Diagnostic((Diagnostic *)in_RDI,in_stack_ffffffffffffffb8,*in_RDX,*in_RCX);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }